

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colAlloc.c
# Opt level: O0

void ClearCells(Page *page,size_t first,size_t number)

{
  ulong local_30;
  size_t i;
  uchar *mask;
  size_t number_local;
  size_t first_local;
  Page *page_local;
  
  for (local_30 = first; local_30 < first + number; local_30 = local_30 + 1) {
    (*page)[(local_30 >> 3) + 0x10] =
         (*page)[(local_30 >> 3) + 0x10] & ((byte)(1 << ((byte)local_30 & 7)) ^ 0xff);
  }
  return;
}

Assistant:

void
ClearCells(
    Page *page,     /*!< The page. */
    size_t first,   /*!< Index of first cell. */
    size_t number)  /*!< Number of cells in sequence. */
{
#if CELLS_PER_PAGE == 64
#   ifdef COL_BIGENDIAN
        *(uint64_t*) PAGE_BITMASK(page) &= ~(((((uint64_t)1)<<number)-1)<<(64-number-first));
#   else
        *(uint64_t*) PAGE_BITMASK(page) &= ~(((((uint64_t)1)<<number)-1)<<first);
#   endif
#else
    unsigned char *mask = PAGE_BITMASK(page);
    size_t i;
    for (i=first; i < first+number; i++) {
        mask[i>>3] &= ~(1<<(i&7));
    }
#endif
}